

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

int __thiscall xmrig::Controller::init(Controller *this,EVP_PKEY_CTX *ctx)

{
  Config *pCVar1;
  CpuConfig *pCVar2;
  VirtualMemory *this_00;
  Network *this_01;
  
  Base::init(&this->super_Base,ctx);
  pCVar1 = Base::config(&this->super_Base);
  pCVar2 = Config::cpu(pCVar1);
  this_00 = (VirtualMemory *)CpuConfig::memPoolSize(pCVar2);
  pCVar1 = Base::config(&this->super_Base);
  pCVar2 = Config::cpu(pCVar1);
  VirtualMemory::init(this_00,(EVP_PKEY_CTX *)(ulong)pCVar2->m_hugePages);
  this_01 = (Network *)operator_new(0x218);
  Network::Network(this_01,this);
  this->m_network = this_01;
  return 0;
}

Assistant:

int xmrig::Controller::init()
{
    Base::init();

    VirtualMemory::init(config()->cpu().memPoolSize(), config()->cpu().isHugePages());

    m_network = new Network(this);

    return 0;
}